

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.c
# Opt level: O0

feed_db_status_t import_feed_db(char *dir,feed_db_t *db)

{
  feed_db_status_t fVar1;
  char *table;
  int local_44;
  int i;
  char *table_file_name;
  char *full_file_name;
  char **ppcStack_28;
  int filecount;
  char **filenames;
  feed_db_t *db_local;
  char *dir_local;
  
  full_file_name._4_4_ = 0;
  filenames = &db->path;
  db_local = (feed_db_t *)dir;
  full_file_name._4_4_ = list_txt_files(dir,&stack0xffffffffffffffd8);
  begin_transaction_db((feed_db_t *)filenames);
  local_44 = 0;
  while( true ) {
    if (full_file_name._4_4_ <= local_44) {
      end_transaction_db((feed_db_t *)filenames);
      free_cstr_arr(ppcStack_28,(long)full_file_name._4_4_);
      return FEED_DB_SUCCESS;
    }
    make_filepath(&table_file_name,(char *)db_local,ppcStack_28[local_44]);
    table = get_filename_no_ext(ppcStack_28[local_44],'/');
    fVar1 = import_csv_file_db(table_file_name,table,(feed_db_t *)filenames);
    if (fVar1 != FEED_DB_SUCCESS) break;
    free(table);
    free(table_file_name);
    local_44 = local_44 + 1;
  }
  free(table);
  free(table_file_name);
  free_cstr_arr(ppcStack_28,(long)full_file_name._4_4_);
  return FEED_DB_ERROR;
}

Assistant:

feed_db_status_t import_feed_db(const char *dir, feed_db_t *db) {
    char **filenames;
    int filecount = 0;

    char *full_file_name;
    char *table_file_name;

    filecount = list_txt_files(dir, &filenames);

    begin_transaction_db(db);

    for (int i = 0; i < filecount; i++) {
        make_filepath(&full_file_name, dir, filenames[i]);
        table_file_name = get_filename_no_ext(filenames[i], *FILENAME_SEPARATOR);

        if (FEED_DB_SUCCESS != import_csv_file_db(full_file_name, table_file_name, db)) {
            free(table_file_name);
            free(full_file_name);
            free_cstr_arr(filenames, filecount);
            return FEED_DB_ERROR;
        }
        free(table_file_name);
        free(full_file_name);
    }

    end_transaction_db(db);

    free_cstr_arr(filenames, filecount);
    return FEED_DB_SUCCESS;
}